

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void parse_cache(vw *all,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *cache_files,bool kill_cache,bool quiet)

{
  vw_ostream *pvVar1;
  pointer pbVar2;
  io_buf *piVar3;
  char *pcVar4;
  char cVar5;
  int filepointer;
  uint32_t uVar6;
  size_t sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  pointer newname;
  
  all->p->write_cache = false;
  newname = (cache_files->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (cache_files->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (newname != pbVar2) {
    pvVar1 = &all->trace_message;
    do {
      if ((kill_cache) ||
         (piVar3 = all->p->input,
         filepointer = (**piVar3->_vptr_io_buf)
                                 (piVar3,(newname->_M_dataplus)._M_p,(ulong)all->stdin_off,1),
         filepointer == -1)) {
LAB_001b25c4:
        make_write_cache(all,newname,quiet);
      }
      else {
        uVar6 = cache_numbits(all->p->input,filepointer);
        cVar5 = (char)pvVar1;
        if (uVar6 < all->num_bits) {
          if (!quiet) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pvVar1->super_ostream,
                       "WARNING: cache file is ignored as it\'s made with less bit precision than required!"
                       ,0x52);
            std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + cVar5);
            std::ostream::put(cVar5);
            std::ostream::flush();
          }
          (*all->p->input->_vptr_io_buf[8])();
          goto LAB_001b25c4;
        }
        if (!quiet) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&pvVar1->super_ostream,"using cache_file = ",0x13);
          pcVar4 = (newname->_M_dataplus)._M_p;
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)pvVar1 + (int)(pvVar1->super_ostream)._vptr_basic_ostream[-3]);
          }
          else {
            sVar7 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,pcVar4,sVar7);
          }
          std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
        }
        all->p->reader = read_cached_features;
        all->p->sorted_cache = uVar6 == all->num_bits;
        all->p->resettable = true;
      }
      newname = newname + 1;
    } while (newname != pbVar2);
  }
  all->parse_mask = ~(-1L << ((byte)all->num_bits & 0x3f));
  if ((cache_files->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (cache_files->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    if (!quiet) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(all->trace_message).super_ostream,"using no cache",0xe);
      cVar5 = (char)&all->trace_message;
      std::ios::widen((char)(all->trace_message).super_ostream._vptr_basic_ostream[-3] + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
    }
    piVar3 = all->p->output;
    pcVar4 = (piVar3->space)._begin;
    if (pcVar4 != (char *)0x0) {
      free(pcVar4);
    }
    (piVar3->space)._begin = (char *)0x0;
    (piVar3->space)._end = (char *)0x0;
    (piVar3->space).end_array = (char *)0x0;
  }
  return;
}

Assistant:

void parse_cache(vw& all, std::vector<std::string> cache_files, bool kill_cache, bool quiet)
{
  all.p->write_cache = false;

  for (auto& file : cache_files)
  {
    int f = -1;
    if (!kill_cache)
      try
      {
        f = all.p->input->open_file(file.c_str(), all.stdin_off, io_buf::READ);
      }
      catch (const exception&)
      {
        f = -1;
      }
    if (f == -1)
      make_write_cache(all, file, quiet);
    else
    {
      uint64_t c = cache_numbits(all.p->input, f);
      if (c < all.num_bits)
      {
        if (!quiet)
          all.trace_message << "WARNING: cache file is ignored as it's made with less bit precision than required!"
                            << endl;
        all.p->input->close_file();
        make_write_cache(all, file, quiet);
      }
      else
      {
        if (!quiet)
          all.trace_message << "using cache_file = " << file.c_str() << endl;
        all.p->reader = read_cached_features;
        if (c == all.num_bits)
          all.p->sorted_cache = true;
        else
          all.p->sorted_cache = false;
        all.p->resettable = true;
      }
    }
  }

  all.parse_mask = ((uint64_t)1 << all.num_bits) - 1;
  if (cache_files.size() == 0)
  {
    if (!quiet)
      all.trace_message << "using no cache" << endl;
    all.p->output->space.delete_v();
  }
}